

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_16777232,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMvMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  int iVar1;
  undefined4 uVar2;
  Scene *pSVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  undefined1 auVar9 [32];
  undefined8 uVar10;
  ulong uVar11;
  ulong uVar12;
  undefined8 uVar13;
  byte bVar14;
  int iVar15;
  int iVar16;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar17;
  byte bVar18;
  AABBNodeMB4D *node1;
  undefined1 (*pauVar19) [32];
  long lVar20;
  byte bVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  uint uVar25;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  ulong uVar26;
  size_t sVar27;
  ulong uVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [64];
  undefined1 auVar73 [32];
  undefined1 auVar74 [64];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined4 uVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar87;
  float fVar88;
  undefined1 auVar86 [16];
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 local_2678 [16];
  StackItemT<embree::NodeRefPtr<8>_> *local_2660;
  long local_2658;
  long local_2650;
  RTCFilterFunctionNArguments args;
  undefined1 local_24f8 [16];
  undefined1 local_24e8 [16];
  undefined1 local_24d8 [16];
  undefined1 local_24c8 [16];
  undefined1 local_24b8 [16];
  float local_24a8 [4];
  undefined1 local_2498 [16];
  RTCHitN local_2488 [16];
  undefined1 local_2478 [16];
  undefined1 local_2468 [16];
  undefined1 local_2458 [16];
  undefined4 local_2448;
  undefined4 uStack_2444;
  undefined4 uStack_2440;
  undefined4 uStack_243c;
  undefined1 local_2438 [16];
  undefined1 local_2428 [16];
  uint local_2418;
  uint uStack_2414;
  uint uStack_2410;
  uint uStack_240c;
  uint uStack_2408;
  uint uStack_2404;
  uint uStack_2400;
  uint uStack_23fc;
  undefined1 local_23f8 [32];
  float local_23d8;
  float fStack_23d4;
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  float fStack_23c4;
  float fStack_23c0;
  float fStack_23bc;
  float local_23b8;
  float fStack_23b4;
  float fStack_23b0;
  float fStack_23ac;
  float fStack_23a8;
  float fStack_23a4;
  float fStack_23a0;
  float fStack_239c;
  float local_2398;
  float fStack_2394;
  float fStack_2390;
  float fStack_238c;
  float fStack_2388;
  float fStack_2384;
  float fStack_2380;
  float fStack_237c;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  
  local_2660 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  auVar56 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar57 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar58 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  fVar78 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar85 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar93 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar59 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar78 * 0.99999964)));
  auVar60 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar85 * 0.99999964)));
  auVar61 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar93 * 0.99999964)));
  fVar78 = fVar78 * 1.0000004;
  fVar85 = fVar85 * 1.0000004;
  fVar93 = fVar93 * 1.0000004;
  uVar26 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar28 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar1 = (tray->tnear).field_0.i[k];
  local_23f8._4_4_ = iVar1;
  local_23f8._0_4_ = iVar1;
  local_23f8._8_4_ = iVar1;
  local_23f8._12_4_ = iVar1;
  local_23f8._16_4_ = iVar1;
  local_23f8._20_4_ = iVar1;
  local_23f8._24_4_ = iVar1;
  local_23f8._28_4_ = iVar1;
  auVar100 = ZEXT3264(local_23f8);
  iVar1 = (tray->tfar).field_0.i[k];
  auVar72 = ZEXT3264(CONCAT428(iVar1,CONCAT424(iVar1,CONCAT420(iVar1,CONCAT416(iVar1,CONCAT412(iVar1
                                                  ,CONCAT48(iVar1,CONCAT44(iVar1,iVar1))))))));
  local_2498 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar101 = ZEXT3264(_DAT_01fe9900);
  auVar102 = ZEXT3264(CONCAT428(0xfffffff8,
                                CONCAT424(0xfffffff8,
                                          CONCAT420(0xfffffff8,
                                                    CONCAT416(0xfffffff8,
                                                              CONCAT412(0xfffffff8,
                                                                        CONCAT48(0xfffffff8,
                                                                                 0xfffffff8fffffff8)
                                                                       ))))));
  local_2398 = fVar78;
  fStack_2394 = fVar78;
  fStack_2390 = fVar78;
  fStack_238c = fVar78;
  fStack_2388 = fVar78;
  fStack_2384 = fVar78;
  fStack_2380 = fVar78;
  fStack_237c = fVar78;
  local_23b8 = fVar85;
  fStack_23b4 = fVar85;
  fStack_23b0 = fVar85;
  fStack_23ac = fVar85;
  fStack_23a8 = fVar85;
  fStack_23a4 = fVar85;
  fStack_23a0 = fVar85;
  fStack_239c = fVar85;
  local_23d8 = fVar93;
  fStack_23d4 = fVar93;
  fStack_23d0 = fVar93;
  fStack_23cc = fVar93;
  fStack_23c8 = fVar93;
  fStack_23c4 = fVar93;
  fStack_23c0 = fVar93;
  fStack_23bc = fVar93;
  fVar79 = fVar78;
  fVar80 = fVar78;
  fVar81 = fVar78;
  fVar82 = fVar78;
  fVar83 = fVar78;
  fVar84 = fVar78;
  fVar87 = fVar85;
  fVar88 = fVar85;
  fVar89 = fVar85;
  fVar90 = fVar85;
  fVar91 = fVar85;
  fVar92 = fVar85;
  fVar94 = fVar93;
  fVar95 = fVar93;
  fVar96 = fVar93;
  fVar97 = fVar93;
  fVar98 = fVar93;
  fVar99 = fVar93;
  do {
    pSVar17 = local_2660 + -1;
    local_2660 = local_2660 + -1;
    if ((float)pSVar17->dist <= *(float *)(ray + k * 4 + 0x80)) {
      sVar27 = (local_2660->ptr).ptr;
      while ((sVar27 & 8) == 0) {
        pauVar19 = (undefined1 (*) [32])(sVar27 & 0xfffffffffffffff0);
        uVar77 = *(undefined4 *)(ray + k * 4 + 0x70);
        auVar69._4_4_ = uVar77;
        auVar69._0_4_ = uVar77;
        auVar69._8_4_ = uVar77;
        auVar69._12_4_ = uVar77;
        auVar69._16_4_ = uVar77;
        auVar69._20_4_ = uVar77;
        auVar69._24_4_ = uVar77;
        auVar69._28_4_ = uVar77;
        auVar54 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar19[8] + uVar26),auVar69,
                                  *(undefined1 (*) [32])(pauVar19[2] + uVar26));
        auVar62 = vsubps_avx512vl(ZEXT1632(auVar54),auVar56);
        auVar62 = vmulps_avx512vl(auVar59,auVar62);
        auVar62 = vmaxps_avx(auVar100._0_32_,auVar62);
        auVar54 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar19[8] + uVar24),auVar69,
                                  *(undefined1 (*) [32])(pauVar19[2] + uVar24));
        auVar63 = vsubps_avx512vl(ZEXT1632(auVar54),auVar57);
        auVar63 = vmulps_avx512vl(auVar60,auVar63);
        auVar54 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar19[8] + uVar28),auVar69,
                                  *(undefined1 (*) [32])(pauVar19[2] + uVar28));
        auVar64 = vsubps_avx512vl(ZEXT1632(auVar54),auVar58);
        auVar64 = vmulps_avx512vl(auVar61,auVar64);
        auVar63 = vmaxps_avx(auVar63,auVar64);
        auVar62 = vmaxps_avx(auVar62,auVar63);
        auVar54 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar19[8] + (uVar26 ^ 0x20)),auVar69,
                                  *(undefined1 (*) [32])(pauVar19[2] + (uVar26 ^ 0x20)));
        auVar63 = vsubps_avx512vl(ZEXT1632(auVar54),auVar56);
        auVar64._4_4_ = fVar79 * auVar63._4_4_;
        auVar64._0_4_ = fVar78 * auVar63._0_4_;
        auVar64._8_4_ = fVar80 * auVar63._8_4_;
        auVar64._12_4_ = fVar81 * auVar63._12_4_;
        auVar64._16_4_ = fVar82 * auVar63._16_4_;
        auVar64._20_4_ = fVar83 * auVar63._20_4_;
        auVar64._24_4_ = fVar84 * auVar63._24_4_;
        auVar64._28_4_ = auVar63._28_4_;
        auVar54 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar19[8] + (uVar24 ^ 0x20)),auVar69,
                                  *(undefined1 (*) [32])(pauVar19[2] + (uVar24 ^ 0x20)));
        auVar65 = vsubps_avx512vl(ZEXT1632(auVar54),auVar57);
        auVar63._4_4_ = fVar87 * auVar65._4_4_;
        auVar63._0_4_ = fVar85 * auVar65._0_4_;
        auVar63._8_4_ = fVar88 * auVar65._8_4_;
        auVar63._12_4_ = fVar89 * auVar65._12_4_;
        auVar63._16_4_ = fVar90 * auVar65._16_4_;
        auVar63._20_4_ = fVar91 * auVar65._20_4_;
        auVar63._24_4_ = fVar92 * auVar65._24_4_;
        auVar63._28_4_ = auVar65._28_4_;
        auVar54 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar19[8] + (uVar28 ^ 0x20)),auVar69,
                                  *(undefined1 (*) [32])(pauVar19[2] + (uVar28 ^ 0x20)));
        auVar66 = vsubps_avx512vl(ZEXT1632(auVar54),auVar58);
        auVar65._4_4_ = fVar94 * auVar66._4_4_;
        auVar65._0_4_ = fVar93 * auVar66._0_4_;
        auVar65._8_4_ = fVar95 * auVar66._8_4_;
        auVar65._12_4_ = fVar96 * auVar66._12_4_;
        auVar65._16_4_ = fVar97 * auVar66._16_4_;
        auVar65._20_4_ = fVar98 * auVar66._20_4_;
        auVar65._24_4_ = fVar99 * auVar66._24_4_;
        auVar65._28_4_ = auVar66._28_4_;
        auVar63 = vminps_avx(auVar63,auVar65);
        auVar64 = vminps_avx(auVar72._0_32_,auVar64);
        auVar63 = vminps_avx(auVar64,auVar63);
        uVar30 = vcmpps_avx512vl(auVar62,auVar63,2);
        if (((uint)sVar27 & 7) == 6) {
          uVar31 = vcmpps_avx512vl(auVar69,pauVar19[0xe],0xd);
          uVar12 = vcmpps_avx512vl(auVar69,pauVar19[0xf],1);
          uVar30 = uVar30 & uVar31 & uVar12;
        }
        bVar18 = (byte)uVar30;
        if (bVar18 == 0) goto LAB_0079027f;
        auVar63 = *pauVar19;
        auVar64 = pauVar19[1];
        auVar65 = vpternlogd_avx512vl(auVar101._0_32_,auVar62,auVar102._0_32_,0xf8);
        auVar66 = vpcompressd_avx512vl(auVar65);
        auVar68._0_4_ =
             (uint)(bVar18 & 1) * auVar66._0_4_ | (uint)!(bool)(bVar18 & 1) * auVar65._0_4_;
        bVar8 = (bool)((byte)(uVar30 >> 1) & 1);
        auVar68._4_4_ = (uint)bVar8 * auVar66._4_4_ | (uint)!bVar8 * auVar65._4_4_;
        bVar8 = (bool)((byte)(uVar30 >> 2) & 1);
        auVar68._8_4_ = (uint)bVar8 * auVar66._8_4_ | (uint)!bVar8 * auVar65._8_4_;
        bVar8 = (bool)((byte)(uVar30 >> 3) & 1);
        auVar68._12_4_ = (uint)bVar8 * auVar66._12_4_ | (uint)!bVar8 * auVar65._12_4_;
        bVar8 = (bool)((byte)(uVar30 >> 4) & 1);
        auVar68._16_4_ = (uint)bVar8 * auVar66._16_4_ | (uint)!bVar8 * auVar65._16_4_;
        bVar8 = (bool)((byte)(uVar30 >> 5) & 1);
        auVar68._20_4_ = (uint)bVar8 * auVar66._20_4_ | (uint)!bVar8 * auVar65._20_4_;
        bVar8 = (bool)((byte)(uVar30 >> 6) & 1);
        auVar68._24_4_ = (uint)bVar8 * auVar66._24_4_ | (uint)!bVar8 * auVar65._24_4_;
        bVar8 = SUB81(uVar30 >> 7,0);
        auVar68._28_4_ = (uint)bVar8 * auVar66._28_4_ | (uint)!bVar8 * auVar65._28_4_;
        auVar65 = vpermt2q_avx512vl(auVar63,auVar68,auVar64);
        sVar27 = auVar65._0_8_;
        bVar18 = bVar18 - 1 & bVar18;
        if (bVar18 != 0) {
          auVar65 = vpshufd_avx2(auVar68,0x55);
          vpermt2q_avx512vl(auVar63,auVar65,auVar64);
          auVar66 = vpminsd_avx2(auVar68,auVar65);
          auVar65 = vpmaxsd_avx2(auVar68,auVar65);
          bVar18 = bVar18 - 1 & bVar18;
          if (bVar18 == 0) {
            auVar66 = vpermi2q_avx512vl(auVar66,auVar63,auVar64);
            sVar27 = auVar66._0_8_;
            auVar63 = vpermt2q_avx512vl(auVar63,auVar65,auVar64);
            (local_2660->ptr).ptr = auVar63._0_8_;
            auVar62 = vpermd_avx2(auVar65,auVar62);
            local_2660->dist = auVar62._0_4_;
            local_2660 = local_2660 + 1;
          }
          else {
            auVar73 = vpshufd_avx2(auVar68,0xaa);
            vpermt2q_avx512vl(auVar63,auVar73,auVar64);
            auVar69 = vpminsd_avx2(auVar66,auVar73);
            auVar66 = vpmaxsd_avx2(auVar66,auVar73);
            auVar73 = vpminsd_avx2(auVar65,auVar66);
            auVar65 = vpmaxsd_avx2(auVar65,auVar66);
            bVar18 = bVar18 - 1 & bVar18;
            if (bVar18 == 0) {
              auVar66 = vpermi2q_avx512vl(auVar69,auVar63,auVar64);
              sVar27 = auVar66._0_8_;
              auVar66 = vpermt2q_avx512vl(auVar63,auVar65,auVar64);
              (local_2660->ptr).ptr = auVar66._0_8_;
              auVar65 = vpermd_avx2(auVar65,auVar62);
              local_2660->dist = auVar65._0_4_;
              auVar63 = vpermt2q_avx512vl(auVar63,auVar73,auVar64);
              local_2660[1].ptr.ptr = auVar63._0_8_;
              auVar62 = vpermd_avx2(auVar73,auVar62);
              local_2660[1].dist = auVar62._0_4_;
              local_2660 = local_2660 + 2;
            }
            else {
              auVar66 = vpshufd_avx2(auVar68,0xff);
              vpermt2q_avx512vl(auVar63,auVar66,auVar64);
              auVar9 = vpminsd_avx2(auVar69,auVar66);
              auVar66 = vpmaxsd_avx2(auVar69,auVar66);
              auVar69 = vpminsd_avx2(auVar73,auVar66);
              auVar66 = vpmaxsd_avx2(auVar73,auVar66);
              auVar73 = vpminsd_avx2(auVar65,auVar66);
              auVar65 = vpmaxsd_avx2(auVar65,auVar66);
              bVar18 = bVar18 - 1 & bVar18;
              if (bVar18 == 0) {
                auVar66 = vpermi2q_avx512vl(auVar9,auVar63,auVar64);
                sVar27 = auVar66._0_8_;
                auVar66 = vpermt2q_avx512vl(auVar63,auVar65,auVar64);
                (local_2660->ptr).ptr = auVar66._0_8_;
                auVar65 = vpermd_avx2(auVar65,auVar62);
                local_2660->dist = auVar65._0_4_;
                auVar65 = vpermt2q_avx512vl(auVar63,auVar73,auVar64);
                local_2660[1].ptr.ptr = auVar65._0_8_;
                auVar65 = vpermd_avx2(auVar73,auVar62);
                local_2660[1].dist = auVar65._0_4_;
                auVar63 = vpermt2q_avx512vl(auVar63,auVar69,auVar64);
                local_2660[2].ptr.ptr = auVar63._0_8_;
                auVar62 = vpermd_avx2(auVar69,auVar62);
                local_2660[2].dist = auVar62._0_4_;
                local_2660 = local_2660 + 3;
              }
              else {
                auVar67 = valignd_avx512vl(auVar68,auVar68,3);
                auVar66 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                auVar68 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                               CONCAT48(0x80000000,
                                                                        0x8000000080000000))),
                                            auVar66,auVar9);
                auVar66 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                auVar69 = vpermt2d_avx512vl(auVar68,auVar66,auVar69);
                auVar69 = vpermt2d_avx512vl(auVar69,auVar66,auVar73);
                auVar66 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                auVar65 = vpermt2d_avx512vl(auVar69,auVar66,auVar65);
                auVar74 = ZEXT3264(auVar65);
                bVar21 = bVar18;
                do {
                  auVar66 = auVar74._0_32_;
                  auVar73._8_4_ = 1;
                  auVar73._0_8_ = 0x100000001;
                  auVar73._12_4_ = 1;
                  auVar73._16_4_ = 1;
                  auVar73._20_4_ = 1;
                  auVar73._24_4_ = 1;
                  auVar73._28_4_ = 1;
                  auVar65 = vpermd_avx2(auVar73,auVar67);
                  auVar67 = valignd_avx512vl(auVar67,auVar67,1);
                  vpermt2q_avx512vl(auVar63,auVar67,auVar64);
                  bVar21 = bVar21 - 1 & bVar21;
                  uVar13 = vpcmpd_avx512vl(auVar65,auVar66,5);
                  auVar65 = vpmaxsd_avx2(auVar65,auVar66);
                  bVar14 = (byte)uVar13 << 1;
                  auVar69 = valignd_avx512vl(auVar66,auVar66,7);
                  bVar8 = (bool)((byte)uVar13 & 1);
                  auVar66._4_4_ = (uint)bVar8 * auVar69._4_4_ | (uint)!bVar8 * auVar65._4_4_;
                  auVar66._0_4_ = auVar65._0_4_;
                  bVar8 = (bool)(bVar14 >> 2 & 1);
                  auVar66._8_4_ = (uint)bVar8 * auVar69._8_4_ | (uint)!bVar8 * auVar65._8_4_;
                  bVar8 = (bool)(bVar14 >> 3 & 1);
                  auVar66._12_4_ = (uint)bVar8 * auVar69._12_4_ | (uint)!bVar8 * auVar65._12_4_;
                  bVar8 = (bool)(bVar14 >> 4 & 1);
                  auVar66._16_4_ = (uint)bVar8 * auVar69._16_4_ | (uint)!bVar8 * auVar65._16_4_;
                  bVar8 = (bool)(bVar14 >> 5 & 1);
                  auVar66._20_4_ = (uint)bVar8 * auVar69._20_4_ | (uint)!bVar8 * auVar65._20_4_;
                  bVar8 = (bool)(bVar14 >> 6 & 1);
                  auVar66._24_4_ = (uint)bVar8 * auVar69._24_4_ | (uint)!bVar8 * auVar65._24_4_;
                  auVar66._28_4_ =
                       (uint)(bVar14 >> 7) * auVar69._28_4_ |
                       (uint)!(bool)(bVar14 >> 7) * auVar65._28_4_;
                  auVar74 = ZEXT3264(auVar66);
                } while (bVar21 != 0);
                lVar20 = (ulong)(uint)POPCOUNT((uint)bVar18) + 3;
                do {
                  auVar65 = vpermi2q_avx512vl(auVar66,auVar63,auVar64);
                  (local_2660->ptr).ptr = auVar65._0_8_;
                  auVar66 = auVar74._0_32_;
                  auVar65 = vpermd_avx2(auVar66,auVar62);
                  local_2660->dist = auVar65._0_4_;
                  auVar66 = valignd_avx512vl(auVar66,auVar66,1);
                  local_2660 = local_2660 + 1;
                  auVar74 = ZEXT3264(auVar66);
                  lVar20 = lVar20 + -1;
                } while (lVar20 != 0);
                auVar62 = vpermt2q_avx512vl(auVar63,auVar66,auVar64);
                sVar27 = auVar62._0_8_;
              }
              auVar100 = ZEXT3264(auVar100._0_32_);
              auVar101 = ZEXT3264(auVar101._0_32_);
              auVar102 = ZEXT3264(auVar102._0_32_);
            }
          }
        }
      }
      local_2658 = (ulong)((uint)sVar27 & 0xf) - 8;
      if (local_2658 != 0) {
        uVar30 = sVar27 & 0xfffffffffffffff0;
        local_2650 = 0;
        do {
          lVar20 = local_2650 * 0x140;
          uVar77 = *(undefined4 *)(ray + k * 4 + 0x70);
          auVar41._4_4_ = uVar77;
          auVar41._0_4_ = uVar77;
          auVar41._8_4_ = uVar77;
          auVar41._12_4_ = uVar77;
          auVar54 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0x90 + lVar20),auVar41,
                                    *(undefined1 (*) [16])(uVar30 + lVar20));
          auVar52 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0xa0 + lVar20),auVar41,
                                    *(undefined1 (*) [16])(uVar30 + 0x10 + lVar20));
          auVar53 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0xb0 + lVar20),auVar41,
                                    *(undefined1 (*) [16])(uVar30 + 0x20 + lVar20));
          auVar47 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0xc0 + lVar20),auVar41,
                                    *(undefined1 (*) [16])(uVar30 + 0x30 + lVar20));
          auVar37 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0xd0 + lVar20),auVar41,
                                    *(undefined1 (*) [16])(uVar30 + 0x40 + lVar20));
          auVar38 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0xe0 + lVar20),auVar41,
                                    *(undefined1 (*) [16])(uVar30 + 0x50 + lVar20));
          auVar39 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0xf0 + lVar20),auVar41,
                                    *(undefined1 (*) [16])(uVar30 + 0x60 + lVar20));
          auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0x100 + lVar20),auVar41,
                                    *(undefined1 (*) [16])(uVar30 + 0x70 + lVar20));
          auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0x110 + lVar20),auVar41,
                                    *(undefined1 (*) [16])(uVar30 + 0x80 + lVar20));
          uVar77 = *(undefined4 *)(ray + k * 4);
          auVar42._4_4_ = uVar77;
          auVar42._0_4_ = uVar77;
          auVar42._8_4_ = uVar77;
          auVar42._12_4_ = uVar77;
          auVar32 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x10)));
          auVar33 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
          uVar77 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar75._4_4_ = uVar77;
          auVar75._0_4_ = uVar77;
          auVar75._8_4_ = uVar77;
          auVar75._12_4_ = uVar77;
          uVar77 = *(undefined4 *)(ray + k * 4 + 0x50);
          auVar76._4_4_ = uVar77;
          auVar76._0_4_ = uVar77;
          auVar76._8_4_ = uVar77;
          auVar76._12_4_ = uVar77;
          fVar78 = *(float *)(ray + k * 4 + 0x60);
          auVar86._4_4_ = fVar78;
          auVar86._0_4_ = fVar78;
          auVar86._8_4_ = fVar78;
          auVar86._12_4_ = fVar78;
          auVar54 = vsubps_avx(auVar54,auVar42);
          auVar34 = vsubps_avx512vl(auVar52,auVar32);
          auVar35 = vsubps_avx512vl(auVar53,auVar33);
          auVar36 = vsubps_avx512vl(auVar47,auVar42);
          auVar37 = vsubps_avx512vl(auVar37,auVar32);
          auVar38 = vsubps_avx512vl(auVar38,auVar33);
          auVar39 = vsubps_avx512vl(auVar39,auVar42);
          auVar40 = vsubps_avx512vl(auVar40,auVar32);
          auVar41 = vsubps_avx512vl(auVar41,auVar33);
          auVar32 = vsubps_avx512vl(auVar39,auVar54);
          auVar33 = vsubps_avx512vl(auVar40,auVar34);
          auVar52 = vsubps_avx(auVar41,auVar35);
          auVar42 = vsubps_avx512vl(auVar54,auVar36);
          auVar43 = vsubps_avx512vl(auVar34,auVar37);
          auVar44 = vsubps_avx512vl(auVar35,auVar38);
          auVar45 = vsubps_avx512vl(auVar36,auVar39);
          auVar46 = vsubps_avx512vl(auVar37,auVar40);
          auVar53 = vsubps_avx(auVar38,auVar41);
          auVar47 = vaddps_avx512vl(auVar39,auVar54);
          auVar48 = vaddps_avx512vl(auVar40,auVar34);
          auVar49 = vaddps_avx512vl(auVar41,auVar35);
          auVar50 = vmulps_avx512vl(auVar48,auVar52);
          auVar50 = vfmsub231ps_avx512vl(auVar50,auVar33,auVar49);
          auVar49 = vmulps_avx512vl(auVar49,auVar32);
          auVar49 = vfmsub231ps_avx512vl(auVar49,auVar52,auVar47);
          auVar51._0_4_ = auVar33._0_4_ * auVar47._0_4_;
          auVar51._4_4_ = auVar33._4_4_ * auVar47._4_4_;
          auVar51._8_4_ = auVar33._8_4_ * auVar47._8_4_;
          auVar51._12_4_ = auVar33._12_4_ * auVar47._12_4_;
          auVar47 = vfmsub231ps_fma(auVar51,auVar32,auVar48);
          auVar48._0_4_ = fVar78 * auVar47._0_4_;
          auVar48._4_4_ = fVar78 * auVar47._4_4_;
          auVar48._8_4_ = fVar78 * auVar47._8_4_;
          auVar48._12_4_ = fVar78 * auVar47._12_4_;
          auVar47 = vfmadd231ps_avx512vl(auVar48,auVar76,auVar49);
          auVar48 = vfmadd231ps_avx512vl(auVar47,auVar75,auVar50);
          auVar47 = vaddps_avx512vl(auVar54,auVar36);
          auVar49 = vaddps_avx512vl(auVar34,auVar37);
          auVar50 = vaddps_avx512vl(auVar35,auVar38);
          auVar51 = vmulps_avx512vl(auVar49,auVar44);
          auVar51 = vfmsub231ps_avx512vl(auVar51,auVar43,auVar50);
          auVar50 = vmulps_avx512vl(auVar50,auVar42);
          auVar50 = vfmsub231ps_avx512vl(auVar50,auVar44,auVar47);
          auVar47 = vmulps_avx512vl(auVar47,auVar43);
          auVar47 = vfmsub231ps_avx512vl(auVar47,auVar42,auVar49);
          auVar49._0_4_ = fVar78 * auVar47._0_4_;
          auVar49._4_4_ = fVar78 * auVar47._4_4_;
          auVar49._8_4_ = fVar78 * auVar47._8_4_;
          auVar49._12_4_ = fVar78 * auVar47._12_4_;
          auVar47 = vfmadd231ps_avx512vl(auVar49,auVar76,auVar50);
          auVar49 = vfmadd231ps_avx512vl(auVar47,auVar75,auVar51);
          auVar39 = vaddps_avx512vl(auVar36,auVar39);
          auVar37 = vaddps_avx512vl(auVar37,auVar40);
          auVar40._0_4_ = auVar38._0_4_ + auVar41._0_4_;
          auVar40._4_4_ = auVar38._4_4_ + auVar41._4_4_;
          auVar40._8_4_ = auVar38._8_4_ + auVar41._8_4_;
          auVar40._12_4_ = auVar38._12_4_ + auVar41._12_4_;
          auVar47 = vmulps_avx512vl(auVar37,auVar53);
          auVar47 = vfmsub231ps_fma(auVar47,auVar46,auVar40);
          auVar38._0_4_ = auVar40._0_4_ * auVar45._0_4_;
          auVar38._4_4_ = auVar40._4_4_ * auVar45._4_4_;
          auVar38._8_4_ = auVar40._8_4_ * auVar45._8_4_;
          auVar38._12_4_ = auVar40._12_4_ * auVar45._12_4_;
          auVar38 = vfmsub231ps_avx512vl(auVar38,auVar53,auVar39);
          auVar39 = vmulps_avx512vl(auVar39,auVar46);
          auVar37 = vfmsub231ps_avx512vl(auVar39,auVar45,auVar37);
          auVar37 = vmulps_avx512vl(auVar37,auVar86);
          auVar37 = vfmadd231ps_avx512vl(auVar37,auVar76,auVar38);
          auVar38 = vfmadd231ps_avx512vl(auVar37,auVar75,auVar47);
          auVar39._0_4_ = auVar48._0_4_ + auVar49._0_4_;
          auVar39._4_4_ = auVar48._4_4_ + auVar49._4_4_;
          auVar39._8_4_ = auVar48._8_4_ + auVar49._8_4_;
          auVar39._12_4_ = auVar48._12_4_ + auVar49._12_4_;
          auVar39 = vaddps_avx512vl(auVar38,auVar39);
          auVar47._8_4_ = 0x7fffffff;
          auVar47._0_8_ = 0x7fffffff7fffffff;
          auVar47._12_4_ = 0x7fffffff;
          auVar47 = vandps_avx512vl(auVar39,auVar47);
          auVar37._8_4_ = 0x34000000;
          auVar37._0_8_ = 0x3400000034000000;
          auVar37._12_4_ = 0x34000000;
          auVar37 = vmulps_avx512vl(auVar47,auVar37);
          auVar40 = vminps_avx512vl(auVar48,auVar49);
          auVar40 = vminps_avx512vl(auVar40,auVar38);
          auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar41 = vxorps_avx512vl(auVar37,auVar41);
          uVar13 = vcmpps_avx512vl(auVar40,auVar41,5);
          auVar40 = vmaxps_avx512vl(auVar48,auVar49);
          auVar38 = vmaxps_avx512vl(auVar40,auVar38);
          uVar10 = vcmpps_avx512vl(auVar38,auVar37,2);
          bVar18 = ((byte)uVar13 | (byte)uVar10) & 0xf;
          if (bVar18 != 0) {
            auVar37 = vmulps_avx512vl(auVar43,auVar52);
            auVar38 = vmulps_avx512vl(auVar32,auVar44);
            auVar40 = vmulps_avx512vl(auVar42,auVar33);
            auVar41 = vmulps_avx512vl(auVar46,auVar44);
            auVar36 = vmulps_avx512vl(auVar42,auVar53);
            auVar50 = vmulps_avx512vl(auVar45,auVar43);
            auVar33 = vfmsub213ps_avx512vl(auVar33,auVar44,auVar37);
            auVar52 = vfmsub213ps_avx512vl(auVar52,auVar42,auVar38);
            auVar32 = vfmsub213ps_avx512vl(auVar32,auVar43,auVar40);
            auVar53 = vfmsub213ps_avx512vl(auVar53,auVar43,auVar41);
            auVar43 = vfmsub213ps_avx512vl(auVar45,auVar44,auVar36);
            auVar42 = vfmsub213ps_avx512vl(auVar46,auVar42,auVar50);
            auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar37 = vandps_avx512vl(auVar37,auVar44);
            auVar41 = vandps_avx512vl(auVar41,auVar44);
            uVar31 = vcmpps_avx512vl(auVar37,auVar41,1);
            auVar37 = vandps_avx512vl(auVar38,auVar44);
            auVar38 = vandps_avx512vl(auVar36,auVar44);
            uVar12 = vcmpps_avx512vl(auVar37,auVar38,1);
            auVar37 = vandps_avx512vl(auVar40,auVar44);
            auVar38 = vandps_avx512vl(auVar50,auVar44);
            uVar11 = vcmpps_avx512vl(auVar37,auVar38,1);
            bVar8 = (bool)((byte)uVar31 & 1);
            local_24c8._0_4_ = (uint)bVar8 * auVar33._0_4_ | (uint)!bVar8 * auVar53._0_4_;
            bVar8 = (bool)((byte)(uVar31 >> 1) & 1);
            local_24c8._4_4_ = (uint)bVar8 * auVar33._4_4_ | (uint)!bVar8 * auVar53._4_4_;
            bVar8 = (bool)((byte)(uVar31 >> 2) & 1);
            local_24c8._8_4_ = (uint)bVar8 * auVar33._8_4_ | (uint)!bVar8 * auVar53._8_4_;
            bVar8 = (bool)((byte)(uVar31 >> 3) & 1);
            local_24c8._12_4_ = (uint)bVar8 * auVar33._12_4_ | (uint)!bVar8 * auVar53._12_4_;
            bVar8 = (bool)((byte)uVar12 & 1);
            local_24b8._0_4_ = (uint)bVar8 * auVar52._0_4_ | (uint)!bVar8 * auVar43._0_4_;
            bVar8 = (bool)((byte)(uVar12 >> 1) & 1);
            local_24b8._4_4_ = (uint)bVar8 * auVar52._4_4_ | (uint)!bVar8 * auVar43._4_4_;
            bVar8 = (bool)((byte)(uVar12 >> 2) & 1);
            local_24b8._8_4_ = (uint)bVar8 * auVar52._8_4_ | (uint)!bVar8 * auVar43._8_4_;
            bVar8 = (bool)((byte)(uVar12 >> 3) & 1);
            local_24b8._12_4_ = (uint)bVar8 * auVar52._12_4_ | (uint)!bVar8 * auVar43._12_4_;
            bVar8 = (bool)((byte)uVar11 & 1);
            local_24a8[0] = (float)((uint)bVar8 * auVar32._0_4_ | (uint)!bVar8 * auVar42._0_4_);
            bVar8 = (bool)((byte)(uVar11 >> 1) & 1);
            local_24a8[1] = (float)((uint)bVar8 * auVar32._4_4_ | (uint)!bVar8 * auVar42._4_4_);
            bVar8 = (bool)((byte)(uVar11 >> 2) & 1);
            local_24a8[2] = (float)((uint)bVar8 * auVar32._8_4_ | (uint)!bVar8 * auVar42._8_4_);
            bVar8 = (bool)((byte)(uVar11 >> 3) & 1);
            local_24a8[3] = (float)((uint)bVar8 * auVar32._12_4_ | (uint)!bVar8 * auVar42._12_4_);
            auVar36._0_4_ = fVar78 * local_24a8[0];
            auVar36._4_4_ = fVar78 * local_24a8[1];
            auVar36._8_4_ = fVar78 * local_24a8[2];
            auVar36._12_4_ = fVar78 * local_24a8[3];
            auVar52 = vfmadd213ps_fma(auVar76,local_24b8,auVar36);
            auVar52 = vfmadd213ps_fma(auVar75,local_24c8,auVar52);
            auVar32._0_4_ = auVar52._0_4_ + auVar52._0_4_;
            auVar32._4_4_ = auVar52._4_4_ + auVar52._4_4_;
            auVar32._8_4_ = auVar52._8_4_ + auVar52._8_4_;
            auVar32._12_4_ = auVar52._12_4_ + auVar52._12_4_;
            auVar53._0_4_ = auVar35._0_4_ * local_24a8[0];
            auVar53._4_4_ = auVar35._4_4_ * local_24a8[1];
            auVar53._8_4_ = auVar35._8_4_ * local_24a8[2];
            auVar53._12_4_ = auVar35._12_4_ * local_24a8[3];
            auVar52 = vfmadd213ps_fma(auVar34,local_24b8,auVar53);
            auVar52 = vfmadd213ps_fma(auVar54,local_24c8,auVar52);
            auVar53 = vrcp14ps_avx512vl(auVar32);
            auVar54._8_4_ = 0x3f800000;
            auVar54._0_8_ = 0x3f8000003f800000;
            auVar54._12_4_ = 0x3f800000;
            auVar54 = vfnmadd213ps_avx512vl(auVar53,auVar32,auVar54);
            auVar54 = vfmadd132ps_fma(auVar54,auVar53,auVar53);
            uVar77 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar33._4_4_ = uVar77;
            auVar33._0_4_ = uVar77;
            auVar33._8_4_ = uVar77;
            auVar33._12_4_ = uVar77;
            auVar100 = ZEXT1664(auVar33);
            local_24d8._0_4_ = auVar54._0_4_ * (auVar52._0_4_ + auVar52._0_4_);
            local_24d8._4_4_ = auVar54._4_4_ * (auVar52._4_4_ + auVar52._4_4_);
            local_24d8._8_4_ = auVar54._8_4_ * (auVar52._8_4_ + auVar52._8_4_);
            local_24d8._12_4_ = auVar54._12_4_ * (auVar52._12_4_ + auVar52._12_4_);
            auVar72 = ZEXT1664(local_24d8);
            uVar13 = vcmpps_avx512vl(local_24d8,auVar33,2);
            uVar77 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar52._4_4_ = uVar77;
            auVar52._0_4_ = uVar77;
            auVar52._8_4_ = uVar77;
            auVar52._12_4_ = uVar77;
            uVar10 = vcmpps_avx512vl(local_24d8,auVar52,0xd);
            bVar18 = (byte)uVar13 & (byte)uVar10 & bVar18;
            if (bVar18 != 0) {
              uVar13 = vcmpps_avx512vl(auVar32,_DAT_01f7aa10,4);
              bVar18 = bVar18 & (byte)uVar13;
              uVar29 = (uint)bVar18;
              if (bVar18 != 0) {
                pSVar3 = context->scene;
                auVar34._8_4_ = 0x219392ef;
                auVar34._0_8_ = 0x219392ef219392ef;
                auVar34._12_4_ = 0x219392ef;
                uVar31 = vcmpps_avx512vl(auVar47,auVar34,5);
                auVar52 = vrcp14ps_avx512vl(auVar39);
                auVar46._8_4_ = 0x3f800000;
                auVar46._0_8_ = 0x3f8000003f800000;
                auVar46._12_4_ = 0x3f800000;
                auVar54 = vfnmadd213ps_fma(auVar39,auVar52,auVar46);
                auVar54 = vfmadd132ps_avx512vl(auVar54,auVar52,auVar52);
                fVar78 = (float)((uint)((byte)uVar31 & 1) * auVar54._0_4_);
                fVar79 = (float)((uint)((byte)(uVar31 >> 1) & 1) * auVar54._4_4_);
                fVar93 = (float)((uint)((byte)(uVar31 >> 2) & 1) * auVar54._8_4_);
                fVar85 = (float)((uint)((byte)(uVar31 >> 3) & 1) * auVar54._12_4_);
                auVar43._0_4_ = fVar78 * auVar48._0_4_;
                auVar43._4_4_ = fVar79 * auVar48._4_4_;
                auVar43._8_4_ = fVar93 * auVar48._8_4_;
                auVar43._12_4_ = fVar85 * auVar48._12_4_;
                local_24f8 = vminps_avx(auVar43,auVar46);
                auVar44._0_4_ = fVar78 * auVar49._0_4_;
                auVar44._4_4_ = fVar79 * auVar49._4_4_;
                auVar44._8_4_ = fVar93 * auVar49._8_4_;
                auVar44._12_4_ = fVar85 * auVar49._12_4_;
                local_24e8 = vminps_avx(auVar44,auVar46);
                lVar20 = lVar20 + uVar30;
                auVar45._8_4_ = 0x7f800000;
                auVar45._0_8_ = 0x7f8000007f800000;
                auVar45._12_4_ = 0x7f800000;
                auVar54 = vblendmps_avx512vl(auVar45,local_24d8);
                auVar35._0_4_ =
                     (uint)(bVar18 & 1) * auVar54._0_4_ | (uint)!(bool)(bVar18 & 1) * 0x7f800000;
                bVar8 = (bool)(bVar18 >> 1 & 1);
                auVar35._4_4_ = (uint)bVar8 * auVar54._4_4_ | (uint)!bVar8 * 0x7f800000;
                bVar8 = (bool)(bVar18 >> 2 & 1);
                auVar35._8_4_ = (uint)bVar8 * auVar54._8_4_ | (uint)!bVar8 * 0x7f800000;
                auVar35._12_4_ =
                     (uint)(bVar18 >> 3) * auVar54._12_4_ | (uint)!(bool)(bVar18 >> 3) * 0x7f800000;
                auVar54 = vshufps_avx(auVar35,auVar35,0xb1);
                auVar54 = vminps_avx(auVar54,auVar35);
                auVar52 = vshufpd_avx(auVar54,auVar54,1);
                auVar54 = vminps_avx(auVar52,auVar54);
                uVar13 = vcmpps_avx512vl(auVar35,auVar54,0);
                if (((byte)uVar13 & bVar18) != 0) {
                  bVar18 = (byte)uVar13 & bVar18;
                }
                uVar22 = 0;
                for (uVar23 = (uint)bVar18; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x80000000) {
                  uVar22 = uVar22 + 1;
                }
                do {
                  uVar25 = uVar22 & 0xff;
                  uVar23 = *(uint *)(lVar20 + 0x120 + (ulong)uVar25 * 4);
                  pGVar4 = (pSVar3->geometries).items[uVar23].ptr;
                  if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                    bVar18 = ~(byte)(1 << (uVar22 & 0x1f)) & (byte)uVar29;
                  }
                  else {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      uVar31 = (ulong)(uVar25 << 2);
                      uVar77 = *(undefined4 *)(local_24f8 + uVar31);
                      uVar2 = *(undefined4 *)(local_24e8 + uVar31);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_24d8 + uVar31);
                      *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_24c8 + uVar31);
                      *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_24b8 + uVar31);
                      *(undefined4 *)(ray + k * 4 + 0xe0) =
                           *(undefined4 *)((long)local_24a8 + uVar31);
                      *(undefined4 *)(ray + k * 4 + 0xf0) = uVar77;
                      *(undefined4 *)(ray + k * 4 + 0x100) = uVar2;
                      *(undefined4 *)(ray + k * 4 + 0x110) =
                           *(undefined4 *)(lVar20 + 0x130 + uVar31);
                      *(uint *)(ray + k * 4 + 0x120) = uVar23;
                      *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      break;
                    }
                    uVar31 = (ulong)(uVar25 * 4);
                    uVar77 = *(undefined4 *)(local_24f8 + uVar31);
                    local_2458._4_4_ = uVar77;
                    local_2458._0_4_ = uVar77;
                    local_2458._8_4_ = uVar77;
                    local_2458._12_4_ = uVar77;
                    local_2448 = *(undefined4 *)(local_24e8 + uVar31);
                    local_2428 = vpbroadcastd_avx512vl();
                    uVar77 = *(undefined4 *)(lVar20 + 0x130 + uVar31);
                    local_2438._4_4_ = uVar77;
                    local_2438._0_4_ = uVar77;
                    local_2438._8_4_ = uVar77;
                    local_2438._12_4_ = uVar77;
                    uVar77 = *(undefined4 *)(local_24c8 + uVar31);
                    uVar2 = *(undefined4 *)(local_24b8 + uVar31);
                    local_2478._4_4_ = uVar2;
                    local_2478._0_4_ = uVar2;
                    local_2478._8_4_ = uVar2;
                    local_2478._12_4_ = uVar2;
                    uVar2 = *(undefined4 *)((long)local_24a8 + uVar31);
                    local_2468._4_4_ = uVar2;
                    local_2468._0_4_ = uVar2;
                    local_2468._8_4_ = uVar2;
                    local_2468._12_4_ = uVar2;
                    local_2488[0] = (RTCHitN)(char)uVar77;
                    local_2488[1] = (RTCHitN)(char)((uint)uVar77 >> 8);
                    local_2488[2] = (RTCHitN)(char)((uint)uVar77 >> 0x10);
                    local_2488[3] = (RTCHitN)(char)((uint)uVar77 >> 0x18);
                    local_2488[4] = (RTCHitN)(char)uVar77;
                    local_2488[5] = (RTCHitN)(char)((uint)uVar77 >> 8);
                    local_2488[6] = (RTCHitN)(char)((uint)uVar77 >> 0x10);
                    local_2488[7] = (RTCHitN)(char)((uint)uVar77 >> 0x18);
                    local_2488[8] = (RTCHitN)(char)uVar77;
                    local_2488[9] = (RTCHitN)(char)((uint)uVar77 >> 8);
                    local_2488[10] = (RTCHitN)(char)((uint)uVar77 >> 0x10);
                    local_2488[0xb] = (RTCHitN)(char)((uint)uVar77 >> 0x18);
                    local_2488[0xc] = (RTCHitN)(char)uVar77;
                    local_2488[0xd] = (RTCHitN)(char)((uint)uVar77 >> 8);
                    local_2488[0xe] = (RTCHitN)(char)((uint)uVar77 >> 0x10);
                    local_2488[0xf] = (RTCHitN)(char)((uint)uVar77 >> 0x18);
                    uStack_2444 = local_2448;
                    uStack_2440 = local_2448;
                    uStack_243c = local_2448;
                    vpcmpeqd_avx2(ZEXT1632(local_2458),ZEXT1632(local_2458));
                    uStack_2414 = context->user->instID[0];
                    local_2418 = uStack_2414;
                    uStack_2410 = uStack_2414;
                    uStack_240c = uStack_2414;
                    uStack_2408 = context->user->instPrimID[0];
                    uStack_2404 = uStack_2408;
                    uStack_2400 = uStack_2408;
                    uStack_23fc = uStack_2408;
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_24d8 + uVar31);
                    local_2678 = local_2498;
                    args.valid = (int *)local_2678;
                    args.geometryUserPtr = pGVar4->userPtr;
                    args.context = context->user;
                    args.hit = local_2488;
                    args.N = 4;
                    auVar54 = auVar72._0_16_;
                    auVar52 = auVar100._0_16_;
                    args.ray = (RTCRayN *)ray;
                    if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar4->intersectionFilterN)(&args);
                      auVar100 = ZEXT1664(auVar52);
                      auVar72 = ZEXT1664(auVar54);
                    }
                    uVar31 = vptestmd_avx512vl(local_2678,local_2678);
                    if ((uVar31 & 0xf) == 0) {
LAB_00790131:
                      *(int *)(ray + k * 4 + 0x80) = auVar100._0_4_;
                    }
                    else {
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var5)(&args);
                        auVar100 = ZEXT1664(auVar52);
                        auVar72 = ZEXT1664(auVar54);
                      }
                      uVar31 = vptestmd_avx512vl(local_2678,local_2678);
                      uVar31 = uVar31 & 0xf;
                      bVar18 = (byte)uVar31;
                      if (bVar18 == 0) goto LAB_00790131;
                      iVar1 = *(int *)(args.hit + 4);
                      iVar15 = *(int *)(args.hit + 8);
                      iVar16 = *(int *)(args.hit + 0xc);
                      bVar8 = (bool)((byte)(uVar31 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar31 >> 2) & 1);
                      bVar7 = SUB81(uVar31 >> 3,0);
                      *(uint *)(args.ray + 0xc0) =
                           (uint)(bVar18 & 1) * *(int *)args.hit |
                           (uint)!(bool)(bVar18 & 1) * *(uint *)(args.ray + 0xc0);
                      *(uint *)(args.ray + 0xc4) =
                           (uint)bVar8 * iVar1 | (uint)!bVar8 * *(int *)(args.ray + 0xc4);
                      *(uint *)(args.ray + 200) =
                           (uint)bVar6 * iVar15 | (uint)!bVar6 * *(int *)(args.ray + 200);
                      *(uint *)(args.ray + 0xcc) =
                           (uint)bVar7 * iVar16 | (uint)!bVar7 * *(int *)(args.ray + 0xcc);
                      iVar1 = *(int *)(args.hit + 0x14);
                      iVar15 = *(int *)(args.hit + 0x18);
                      iVar16 = *(int *)(args.hit + 0x1c);
                      bVar8 = (bool)((byte)(uVar31 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar31 >> 2) & 1);
                      bVar7 = SUB81(uVar31 >> 3,0);
                      *(uint *)(args.ray + 0xd0) =
                           (uint)(bVar18 & 1) * *(int *)(args.hit + 0x10) |
                           (uint)!(bool)(bVar18 & 1) * *(uint *)(args.ray + 0xd0);
                      *(uint *)(args.ray + 0xd4) =
                           (uint)bVar8 * iVar1 | (uint)!bVar8 * *(int *)(args.ray + 0xd4);
                      *(uint *)(args.ray + 0xd8) =
                           (uint)bVar6 * iVar15 | (uint)!bVar6 * *(int *)(args.ray + 0xd8);
                      *(uint *)(args.ray + 0xdc) =
                           (uint)bVar7 * iVar16 | (uint)!bVar7 * *(int *)(args.ray + 0xdc);
                      iVar1 = *(int *)(args.hit + 0x24);
                      iVar15 = *(int *)(args.hit + 0x28);
                      iVar16 = *(int *)(args.hit + 0x2c);
                      bVar8 = (bool)((byte)(uVar31 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar31 >> 2) & 1);
                      bVar7 = SUB81(uVar31 >> 3,0);
                      *(uint *)(args.ray + 0xe0) =
                           (uint)(bVar18 & 1) * *(int *)(args.hit + 0x20) |
                           (uint)!(bool)(bVar18 & 1) * *(uint *)(args.ray + 0xe0);
                      *(uint *)(args.ray + 0xe4) =
                           (uint)bVar8 * iVar1 | (uint)!bVar8 * *(int *)(args.ray + 0xe4);
                      *(uint *)(args.ray + 0xe8) =
                           (uint)bVar6 * iVar15 | (uint)!bVar6 * *(int *)(args.ray + 0xe8);
                      *(uint *)(args.ray + 0xec) =
                           (uint)bVar7 * iVar16 | (uint)!bVar7 * *(int *)(args.ray + 0xec);
                      iVar1 = *(int *)(args.hit + 0x34);
                      iVar15 = *(int *)(args.hit + 0x38);
                      iVar16 = *(int *)(args.hit + 0x3c);
                      bVar8 = (bool)((byte)(uVar31 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar31 >> 2) & 1);
                      bVar7 = SUB81(uVar31 >> 3,0);
                      *(uint *)(args.ray + 0xf0) =
                           (uint)(bVar18 & 1) * *(int *)(args.hit + 0x30) |
                           (uint)!(bool)(bVar18 & 1) * *(uint *)(args.ray + 0xf0);
                      *(uint *)(args.ray + 0xf4) =
                           (uint)bVar8 * iVar1 | (uint)!bVar8 * *(int *)(args.ray + 0xf4);
                      *(uint *)(args.ray + 0xf8) =
                           (uint)bVar6 * iVar15 | (uint)!bVar6 * *(int *)(args.ray + 0xf8);
                      *(uint *)(args.ray + 0xfc) =
                           (uint)bVar7 * iVar16 | (uint)!bVar7 * *(int *)(args.ray + 0xfc);
                      auVar54 = *(undefined1 (*) [16])(args.ray + 0x100);
                      auVar50._0_4_ =
                           (uint)(bVar18 & 1) * *(int *)(args.hit + 0x40) |
                           (uint)!(bool)(bVar18 & 1) * auVar54._0_4_;
                      bVar8 = (bool)((byte)(uVar31 >> 1) & 1);
                      auVar50._4_4_ =
                           (uint)bVar8 * *(int *)(args.hit + 0x44) | (uint)!bVar8 * auVar54._4_4_;
                      bVar8 = (bool)((byte)(uVar31 >> 2) & 1);
                      auVar50._8_4_ =
                           (uint)bVar8 * *(int *)(args.hit + 0x48) | (uint)!bVar8 * auVar54._8_4_;
                      bVar8 = SUB81(uVar31 >> 3,0);
                      auVar50._12_4_ =
                           (uint)bVar8 * *(int *)(args.hit + 0x4c) | (uint)!bVar8 * auVar54._12_4_;
                      *(undefined1 (*) [16])(args.ray + 0x100) = auVar50;
                      auVar54 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x50));
                      *(undefined1 (*) [16])(args.ray + 0x110) = auVar54;
                      auVar54 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x60));
                      *(undefined1 (*) [16])(args.ray + 0x120) = auVar54;
                      auVar54 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x70));
                      *(undefined1 (*) [16])(args.ray + 0x130) = auVar54;
                      auVar54 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x80));
                      *(undefined1 (*) [16])(args.ray + 0x140) = auVar54;
                      auVar100 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                    }
                    uVar77 = auVar100._0_4_;
                    auVar71._4_4_ = uVar77;
                    auVar71._0_4_ = uVar77;
                    auVar71._8_4_ = uVar77;
                    auVar71._12_4_ = uVar77;
                    uVar13 = vcmpps_avx512vl(auVar72._0_16_,auVar71,2);
                    bVar18 = ~(byte)(1 << (uVar22 & 0x1f)) & (byte)uVar29 & (byte)uVar13;
                  }
                  uVar29 = (uint)bVar18;
                  if (bVar18 == 0) break;
                  auVar70._8_4_ = 0x7f800000;
                  auVar70._0_8_ = 0x7f8000007f800000;
                  auVar70._12_4_ = 0x7f800000;
                  auVar54 = vblendmps_avx512vl(auVar70,auVar72._0_16_);
                  auVar55._0_4_ =
                       (uint)(bVar18 & 1) * auVar54._0_4_ | (uint)!(bool)(bVar18 & 1) * 0x7f800000;
                  bVar8 = (bool)(bVar18 >> 1 & 1);
                  auVar55._4_4_ = (uint)bVar8 * auVar54._4_4_ | (uint)!bVar8 * 0x7f800000;
                  bVar8 = (bool)(bVar18 >> 2 & 1);
                  auVar55._8_4_ = (uint)bVar8 * auVar54._8_4_ | (uint)!bVar8 * 0x7f800000;
                  auVar55._12_4_ =
                       (uint)(bVar18 >> 3) * auVar54._12_4_ |
                       (uint)!(bool)(bVar18 >> 3) * 0x7f800000;
                  auVar54 = vshufps_avx(auVar55,auVar55,0xb1);
                  auVar54 = vminps_avx(auVar54,auVar55);
                  auVar52 = vshufpd_avx(auVar54,auVar54,1);
                  auVar54 = vminps_avx(auVar52,auVar54);
                  uVar13 = vcmpps_avx512vl(auVar55,auVar54,0);
                  bVar18 = (byte)uVar13 & bVar18;
                  uVar23 = uVar29;
                  if (bVar18 != 0) {
                    uVar23 = (uint)bVar18;
                  }
                  uVar22 = 0;
                  for (; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x80000000) {
                    uVar22 = uVar22 + 1;
                  }
                } while( true );
              }
            }
          }
          local_2650 = local_2650 + 1;
        } while (local_2650 != local_2658);
      }
      uVar77 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar72 = ZEXT3264(CONCAT428(uVar77,CONCAT424(uVar77,CONCAT420(uVar77,CONCAT416(uVar77,
                                                  CONCAT412(uVar77,CONCAT48(uVar77,CONCAT44(uVar77,
                                                  uVar77))))))));
      auVar100 = ZEXT3264(local_23f8);
      auVar101 = ZEXT3264(_DAT_01fe9900);
      auVar102 = ZEXT3264(CONCAT428(0xfffffff8,
                                    CONCAT424(0xfffffff8,
                                              CONCAT420(0xfffffff8,
                                                        CONCAT416(0xfffffff8,
                                                                  CONCAT412(0xfffffff8,
                                                                            CONCAT48(0xfffffff8,
                                                                                                                                                                          
                                                  0xfffffff8fffffff8)))))));
      fVar78 = local_2398;
      fVar79 = fStack_2394;
      fVar80 = fStack_2390;
      fVar81 = fStack_238c;
      fVar82 = fStack_2388;
      fVar83 = fStack_2384;
      fVar84 = fStack_2380;
      fVar85 = local_23b8;
      fVar87 = fStack_23b4;
      fVar88 = fStack_23b0;
      fVar89 = fStack_23ac;
      fVar90 = fStack_23a8;
      fVar91 = fStack_23a4;
      fVar92 = fStack_23a0;
      fVar93 = local_23d8;
      fVar94 = fStack_23d4;
      fVar95 = fStack_23d0;
      fVar96 = fStack_23cc;
      fVar97 = fStack_23c8;
      fVar98 = fStack_23c4;
      fVar99 = fStack_23c0;
    }
LAB_0079027f:
    if (local_2660 == stack) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }